

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DefaultClockingReferenceSyntax *pDVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultClockingReferenceSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DefaultClockingReferenceSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DefaultClockingReferenceSyntax>(
        *deepClone(node.attributes, alloc),
        node.defaultKeyword.deepClone(alloc),
        node.clocking.deepClone(alloc),
        node.name.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}